

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O3

void __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::removeValue(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
              *this,Node *node,Node **value)

{
  float *pfVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  ulong uVar7;
  
  plVar4 = *(long **)&this[1].mBox;
  plVar2 = *(long **)&this[1].mBox.width;
  uVar7 = (long)plVar2 - (long)plVar4;
  if (0 < (long)uVar7 >> 5) {
    plVar3 = (long *)((uVar7 & 0xffffffffffffffe0) + (long)plVar4);
    lVar6 = ((long)uVar7 >> 5) + 1;
    plVar5 = plVar4 + 2;
    do {
      if ((Node *)plVar5[-2] == node) {
        plVar5 = plVar5 + -2;
        goto LAB_00102345;
      }
      if ((Node *)plVar5[-1] == node) {
        plVar5 = plVar5 + -1;
        goto LAB_00102345;
      }
      if ((Node *)*plVar5 == node) goto LAB_00102345;
      if ((Node *)plVar5[1] == node) {
        plVar5 = plVar5 + 1;
        goto LAB_00102345;
      }
      lVar6 = lVar6 + -1;
      plVar5 = plVar5 + 4;
    } while (1 < lVar6);
    uVar7 = (long)plVar2 - (long)plVar3;
    plVar4 = plVar3;
  }
  lVar6 = (long)uVar7 >> 3;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      plVar5 = plVar2;
      if ((lVar6 != 3) || (plVar5 = plVar4, (Node *)*plVar4 == node)) goto LAB_00102345;
      plVar4 = plVar4 + 1;
    }
    plVar5 = plVar4;
    if ((Node *)*plVar4 == node) goto LAB_00102345;
    plVar4 = plVar4 + 1;
  }
  plVar5 = plVar4;
  if ((Node *)*plVar4 != node) {
    plVar5 = plVar2;
  }
LAB_00102345:
  *plVar5 = plVar2[-1];
  pfVar1 = &this[1].mBox.width;
  *(long *)pfVar1 = *(long *)pfVar1 + -8;
  return;
}

Assistant:

void removeValue(Node* node, const T& value)
    {
        // Find the value in node->values
        auto it = std::find_if(std::begin(node->values), std::end(node->values),
            [this, &value](const auto& rhs){ return mEqual(value, rhs); });
        assert(it != std::end(node->values) && "Trying to remove a value that is not present in the node");
        // Swap with the last element and pop back
        *it = std::move(node->values.back());
        node->values.pop_back();
    }